

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O0

bool ON_CRT_LOCALE::ValidateString(char *buffer,size_t sizeof_buffer,int printf_rc)

{
  ulong local_28;
  size_t i;
  bool rc;
  int printf_rc_local;
  size_t sizeof_buffer_local;
  char *buffer_local;
  
  if ((((buffer == (char *)0x0) || (printf_rc < 1)) || (sizeof_buffer == 0)) ||
     (((m_validation_string == (char *)0x0 || (sizeof_buffer < 0x12)) || (printf_rc != 0x11)))) {
    i._3_1_ = false;
  }
  else {
    local_28 = 0;
    while( true ) {
      if (sizeof_buffer <= local_28) {
        return false;
      }
      if (0x11 < local_28) {
        return false;
      }
      if (buffer[local_28] != m_validation_string[local_28]) {
        return false;
      }
      if (m_validation_string[local_28] == '\0') break;
      local_28 = local_28 + 1;
    }
    i._3_1_ = local_28 == 0x11;
  }
  return i._3_1_;
}

Assistant:

static bool ValidateString(
    const char* buffer,
    size_t sizeof_buffer,
    int printf_rc
    )
  {
    bool rc = false;

    if (0 == buffer
      || printf_rc <= 0
      || sizeof_buffer <= 0
      || 0 == m_validation_string
      || m_validation_length <= 0
      || m_validation_length >= sizeof_buffer
      || m_validation_length != (size_t)printf_rc
      )
    {
      rc = (0 == buffer && 0 == sizeof_buffer && 0 == m_validation_string && 0 == m_validation_length && 0 == printf_rc);
    }
    else
    {
      for (size_t i = 0; i < sizeof_buffer; i++)
      {
        if (i > m_validation_length)
          break;
        if (buffer[i] != m_validation_string[i])
          break;
        if (0 == m_validation_string[i])
        {
          rc = (i == m_validation_length);
          break;
        }
      }
    }

    return rc;
  }